

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

int __thiscall
re2::RepetitionWalker::PostVisit
          (RepetitionWalker *this,Regexp *re,int parent_arg,int pre_arg,int *child_args,
          int nchild_args)

{
  int arg;
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)nchild_args;
  if (nchild_args < 1) {
    uVar2 = 0;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    if (child_args[uVar1] < pre_arg) {
      pre_arg = child_args[uVar1];
    }
  }
  return pre_arg;
}

Assistant:

int RepetitionWalker::PostVisit(Regexp* re, int parent_arg, int pre_arg,
                                int* child_args, int nchild_args) {
  int arg = pre_arg;
  for (int i = 0; i < nchild_args; i++) {
    if (child_args[i] < arg) {
      arg = child_args[i];
    }
  }
  return arg;
}